

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Label.cpp
# Opt level: O0

int __thiscall tiles::Label::init(Label *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar1;
  long *in_RCX;
  undefined4 in_EDX;
  TileData *tileData;
  Chunk *in_stack_ffffffffffffff68;
  unique_ptr<entities::Label,_std::default_delete<entities::Label>_> *in_stack_ffffffffffffff70;
  EVP_PKEY_CTX *pEVar2;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  unique_ptr<Entity,_std::default_delete<Entity>_> *in_stack_ffffffffffffff80;
  unique_ptr<Entity,_std::default_delete<Entity>_> *this_00;
  undefined4 in_stack_ffffffffffffff98;
  unique_ptr<Entity,_std::default_delete<Entity>_> local_50 [5];
  TileData *local_28;
  long *local_20;
  undefined4 local_14;
  EVP_PKEY_CTX *local_10;
  Label *local_8;
  
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = ctx;
  local_8 = this;
  local_28 = TileType::modifyTileData
                       ((TileType *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0);
  *local_28 = (TileData)((uint)*local_28 & 0xffffffe0 | 0x12);
  *local_28 = (TileData)((uint)*local_28 & 0xfffffcff);
  *local_28 = (TileData)((uint)*local_28 & 0xfffff3ff);
  *local_28 = (TileData)((uint)*local_28 & 0xffffcfff);
  if (local_20 == (long *)0x0) {
    details::make_unique<entities::Label,_Chunk_&,_unsigned_int_&,_0>
              ((Chunk *)CONCAT44(local_14,in_stack_ffffffffffffff98),(uint *)local_10);
    std::unique_ptr<Entity,std::default_delete<Entity>>::
    unique_ptr<entities::Label,std::default_delete<entities::Label>,void>
              (in_stack_ffffffffffffff80,
               (unique_ptr<entities::Label,_std::default_delete<entities::Label>_> *)
               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    TileType::allocateEntity
              ((TileType *)in_stack_ffffffffffffff80,
               (Chunk *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               (uint)((ulong)in_stack_ffffffffffffff70 >> 0x20),
               (unique_ptr<Entity,_std::default_delete<Entity>_> *)in_stack_ffffffffffffff68);
    std::unique_ptr<Entity,_std::default_delete<Entity>_>::~unique_ptr(in_stack_ffffffffffffff80);
    std::unique_ptr<entities::Label,_std::default_delete<entities::Label>_>::~unique_ptr
              (in_stack_ffffffffffffff70);
    iVar1 = extraout_EAX;
  }
  else {
    this_00 = local_50;
    pEVar2 = local_10;
    (**(code **)(*local_20 + 0x18))();
    TileType::allocateEntity
              ((TileType *)this_00,(Chunk *)CONCAT44(local_14,in_stack_ffffffffffffff78),
               (uint)((ulong)pEVar2 >> 0x20),
               (unique_ptr<Entity,_std::default_delete<Entity>_> *)in_stack_ffffffffffffff68);
    std::unique_ptr<Entity,_std::default_delete<Entity>_>::~unique_ptr(this_00);
    iVar1 = extraout_EAX_00;
  }
  return iVar1;
}

Assistant:

void Label::init(Chunk& chunk, unsigned int tileIndex, const entities::Label* labelToCopy) {
    auto& tileData = modifyTileData(chunk, tileIndex);
    tileData.id = TileId::label;
    tileData.state1 = State::disconnected;
    tileData.state2 = State::disconnected;
    tileData.dir = Direction::north;
    if (labelToCopy == nullptr) {
        allocateEntity(chunk, tileIndex, details::make_unique<entities::Label>(chunk, tileIndex));
    } else {
        allocateEntity(chunk, tileIndex, labelToCopy->clone(chunk, tileIndex));
    }
}